

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O3

int gz_load(gz_statep state,uchar *buf,uint len,uint *have)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  char *msg;
  
  *have = 0;
  uVar3 = 0;
  while( true ) {
    uVar1 = len - uVar3;
    if (0x3fffffff < len - uVar3) {
      uVar1 = 0x40000000;
    }
    sVar4 = read(state->fd,buf + uVar3,(ulong)uVar1);
    iVar2 = (int)sVar4;
    if (iVar2 < 1) break;
    uVar3 = iVar2 + *have;
    *have = uVar3;
    if (len <= uVar3) {
      return 0;
    }
  }
  if (-1 < iVar2) {
    state->eof = 1;
    return 0;
  }
  piVar5 = __errno_location();
  msg = strerror(*piVar5);
  cm_zlib_gz_error(state,-1,msg);
  return -1;
}

Assistant:

local int gz_load(state, buf, len, have)
    gz_statep state;
    unsigned char *buf;
    unsigned len;
    unsigned *have;
{
    int ret;
    unsigned get, max = ((unsigned)-1 >> 2) + 1;

    *have = 0;
    do {
        get = len - *have;
        if (get > max)
            get = max;
        ret = read(state->fd, buf + *have, get);
        if (ret <= 0)
            break;
        *have += (unsigned)ret;
    } while (*have < len);
    if (ret < 0) {
        gz_error(state, Z_ERRNO, zstrerror());
        return -1;
    }
    if (ret == 0)
        state->eof = 1;
    return 0;
}